

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O2

void slab_cache_destroy(slab_cache *cache)

{
  rlist *prVar1;
  rlist *ptr;
  
  ptr = (cache->allocated).slabs.next;
  while (((slab_list *)ptr != &cache->allocated && (prVar1 = ptr->next, prVar1 != (rlist *)0x0))) {
    if (cache->order_max + 1 == (uint)*(byte *)((long)&ptr[2].next + 4)) {
      quota_release(cache->arena->quota,(size_t)ptr[2].prev);
      free(ptr);
      ptr = prVar1;
    }
    else {
      slab_unmap(cache->arena,ptr);
      ptr = prVar1;
    }
  }
  return;
}

Assistant:

void
slab_cache_destroy(struct slab_cache *cache)
{
	struct rlist *slabs = &cache->allocated.slabs;
	/*
	 * cache->allocated contains huge allocations and
	 * slabs of the largest order. All smaller slabs are
	 * obtained from larger slabs by splitting.
	 */
	struct slab *slab, *tmp;
	rlist_foreach_entry_safe(slab, slabs, next_in_cache, tmp) {
		if (slab->order == cache->order_max + 1) {
			size_t slab_size = slab->size;
			quota_release(cache->arena->quota, slab_size);
			VALGRIND_MEMPOOL_FREE(cache, slab_data(slab));
			free(slab);
		} else {
			slab_unmap(cache->arena, slab);
		}
	}


	VALGRIND_DESTROY_MEMPOOL(cache);
}